

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_TAP_UNLIFE(effect_handler_context_t *context)

{
  _Bool _Var1;
  _Bool _Var2;
  wchar_t dam;
  wchar_t wVar3;
  monster_conflict *pmVar4;
  char *dice_string;
  wchar_t wVar5;
  source origin;
  _Bool fear;
  monster_conflict *local_98;
  loc target;
  char m_name [80];
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  fear = false;
  context->ident = true;
  _Var1 = target_set_closest(L'\x01',monster_is_undead);
  if (_Var1) {
    target_get((loc_conflict *)&target);
    pmVar4 = (monster_conflict *)target_get_monster();
    wVar3 = (int)pmVar4->hp;
    if (dam < pmVar4->hp) {
      wVar3 = dam;
    }
    wVar5 = wVar3 + L'\x03';
    if (L'\xffffffff' < wVar3) {
      wVar5 = wVar3;
    }
    monster_desc(m_name,0x50,(monster *)pmVar4,L'\x15');
    if ((player->opts).opt[3] == true) {
      msg("You draw power from the %s. (%d)",m_name,(ulong)(uint)dam);
    }
    else {
      msg("You draw power from the %s.",m_name);
    }
    _Var2 = mon_take_hit(pmVar4,player,dam,&fear," is destroyed!");
    local_98 = pmVar4;
    dice_string = format("%d",(ulong)(uint)(wVar5 >> 2));
    origin._4_4_ = 0;
    origin.what = (context->origin).what;
    origin.which.trap = (context->origin).which.trap;
    effect_simple(L'\x18',origin,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    pmVar4 = local_98;
    if (_Var2) {
      target_set_location(L'\0',L'\0');
    }
    else {
      _Var2 = monster_is_visible((monster *)local_98);
      if (_Var2) {
        message_pain(pmVar4,dam);
        if (fear == true) {
          add_monster_message(pmVar4,L'%',true);
        }
      }
    }
  }
  return _Var1;
}

Assistant:

bool effect_handler_TAP_UNLIFE(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct loc target;
	struct monster *mon = NULL;
	char m_name[80];
	int drain = 0;
	bool fear = false;
	bool dead = false;

	context->ident = true;

	/* Closest living monster */
	if (!target_set_closest(TARGET_KILL, monster_is_undead)) {
		return false;
	}
	target_get(&target);
	mon = target_get_monster();

	/* Hurt the monster */
	drain = MIN(mon->hp, amount) / 4;
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);
	if (OPT(player, show_damage)) {
		msg("You draw power from the %s. (%d)", m_name, amount);
	} else {
		msg("You draw power from the %s.", m_name);
	}
	dead = mon_take_hit(mon, player, amount, &fear, " is destroyed!");

	/* Gain mana */
	effect_simple(EF_RESTORE_MANA, context->origin, format("%d", drain), 0, 0,
				  0, 0, 0, NULL);

	if (dead) {
		/* Cancel the targeting of the dead creature. */
		target_set_location(0, 0);
	} else if (monster_is_visible(mon)) {
		/* Handle fear for surviving monsters */
		message_pain(mon, amount);
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}